

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstructCondense<double>::ContributeKULocal
          (TPZDohrSubstructCondense<double> *this,double alpha,TPZFMatrix<double> *u,
          TPZFMatrix<double> *z)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar3;
  ulong uVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  uint uVar7;
  int64_t size;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  Numbering relat2;
  Numbering relat;
  TPZFMatrix<double> uloc;
  key_type local_310;
  key_type local_308;
  TPZFMatrix<double> local_300;
  TPZFMatrix<double> local_270;
  TPZFMatrix<double> local_1e0;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  lVar8 = (long)this->fNEquations;
  lVar13 = (long)(int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  uVar7 = this->fNEquations - this->fNumInternalEquations;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar13;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar4 = lVar13 * lVar8;
  if (uVar4 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (uVar4 < 0x2000000000000000) {
      uVar12 = uVar4 * 8;
    }
    local_c0.fElem = (double *)operator_new__(uVar12);
    if (0 < (long)uVar4) {
      memset(local_c0.fElem,0,uVar4 * 8);
    }
  }
  lVar11 = (long)(this->fNEquations - this->fNumInternalEquations);
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar13;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar12 = lVar11 * lVar13;
  if (uVar12 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar9 = uVar12 * 8;
    }
    local_150.fElem = (double *)operator_new__(uVar9);
    if (0 < (long)uVar12) {
      memset(local_150.fElem,0,uVar12 * 8);
    }
  }
  lVar11 = (long)(this->fNEquations - this->fNumInternalEquations);
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_1e0.fElem = (double *)0x0;
  local_1e0.fGiven = (double *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar13;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  uVar12 = lVar11 * lVar13;
  if (uVar12 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar9 = uVar12 * 8;
    }
    local_1e0.fElem = (double *)operator_new__(uVar9);
    if (0 < (long)uVar12) {
      memset(local_1e0.fElem,0,uVar12 * 8);
    }
  }
  local_308.first = ExternalFirst;
  local_308.second = Submesh;
  local_310.first = InternalFirst;
  local_310.second = Submesh;
  cVar5 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_308);
  cVar6 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<double>::ENumbering,_TPZDohrSubstructCondense<double>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_310);
  p_Var1 = &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar6._M_node != p_Var1 && (_Rb_tree_header *)cVar5._M_node != p_Var1) {
    PermuteScatter((TPZVec<int> *)&cVar5._M_node[1]._M_parent,u,&local_c0,0,
                   (int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
    PermuteGather((TPZVec<int> *)&cVar6._M_node[1]._M_parent,&local_c0,&local_150,
                  this->fNumInternalEquations,this->fNEquations);
    pTVar3 = ((this->fMatRed).fRef)->fPointer;
    (*(pTVar3->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
              (pTVar3,&local_150,&local_1e0,0);
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018151d8;
    local_270.fElem = (double *)0x0;
    local_270.fGiven = (double *)0x0;
    local_270.fSize = 0;
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar8;
    local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar13;
    TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
    local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
    local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_270.fPivot.super_TPZVec<int>.fNElements = 0;
    local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_270.fWork.fStore = (double *)0x0;
    local_270.fWork.fNElements = 0;
    local_270.fWork.fNAlloc = 0;
    if (uVar4 != 0) {
      uVar12 = 0xffffffffffffffff;
      if (uVar4 < 0x2000000000000000) {
        uVar12 = uVar4 * 8;
      }
      local_270.fElem = (double *)operator_new__(uVar12);
      if (0 < (long)uVar4) {
        memset(local_270.fElem,0,uVar4 * 8);
      }
    }
    iVar2 = this->fNumExternalEquations;
    local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018151d8;
    local_300.fElem = (double *)0x0;
    local_300.fGiven = (double *)0x0;
    local_300.fSize = 0;
    local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)iVar2;
    local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar13;
    TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
    local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
    local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_300.fPivot.super_TPZVec<int>.fNElements = 0;
    local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_300.fWork.fStore = (double *)0x0;
    local_300.fWork.fNElements = 0;
    local_300.fWork.fNAlloc = 0;
    uVar4 = lVar13 * iVar2;
    if (uVar4 != 0) {
      uVar12 = 0xffffffffffffffff;
      if (uVar4 < 0x2000000000000000) {
        uVar12 = uVar4 * 8;
      }
      local_300.fElem = (double *)operator_new__(uVar12);
      if (0 < (long)uVar4) {
        memset(local_300.fElem,0,uVar4 * 8);
      }
    }
    PermuteScatter((TPZVec<int> *)&cVar6._M_node[1]._M_parent,&local_1e0,&local_270,
                   this->fNumInternalEquations,this->fNEquations);
    PermuteGather((TPZVec<int> *)&cVar5._M_node[1]._M_parent,&local_270,&local_300,0,
                  (int)(u->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
    if (0 < (int)uVar7) {
      uVar10 = (uint)(z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      uVar4 = 0;
      do {
        if (0 < (int)uVar10) {
          uVar12 = 0;
          do {
            if ((local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar4) ||
               (local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar12)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar8 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar8 <= (long)uVar4) ||
               ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar12)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar8 = lVar8 * uVar12;
            z->fElem[lVar8 + uVar4] =
                 local_300.fElem
                 [local_300.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar12 + uVar4] *
                 alpha + z->fElem[lVar8 + uVar4];
            uVar12 = uVar12 + 1;
          } while ((uVar10 & 0x7fffffff) != uVar12);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar7);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_300);
    TPZFMatrix<double>::~TPZFMatrix(&local_270);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::ContributeKULocal(const TVar alpha, const TPZFMatrix<TVar> &u, TPZFMatrix<TVar> &z) const
{
	int i,j;
	int nglob = fNEquations;
	int ncols = u.Cols();
	int neqs = fNEquations-fNumInternalEquations;
	TPZFMatrix<TVar> uloc(nglob,ncols,0.), uborder(fNEquations-fNumInternalEquations,ncols,0.),resborder(fNEquations-fNumInternalEquations,ncols,0.);
	typedef std::pair<ENumbering,ENumbering> Numbering;
	Numbering relat(ExternalFirst,Submesh);
	Numbering relat2(InternalFirst,Submesh);
	typename std::map<std::pair<ENumbering, ENumbering> , TPZVec<int> >::const_iterator itrelat, itrelat2;
	itrelat = fPermutationsScatter.find(relat);
	itrelat2 = fPermutationsScatter.find(relat2);
	if(itrelat == fPermutationsScatter.end() || itrelat2 == fPermutationsScatter.end())
	{
		return;
	}
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Scatter from external do submesh" << itrelat->second << std::endl;
		sout << "Scatter from submesh to internal" << itrelat2->second << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	PermuteScatter(itrelat->second, u, uloc, 0, u.Rows());
	PermuteGather(itrelat2->second, uloc, uborder, fNumInternalEquations, fNEquations);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		u.Print("Input matrix ", sout);
		uloc.Print("Natural ordering matrix",sout);
		uborder.Print("Matrix passed to the matred object", sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fMatRed->Multiply(uborder,resborder);
	
	TPZFMatrix<TVar> resglobal(nglob,ncols,0.),resloc(fNumExternalEquations,ncols,0.);
	PermuteScatter(itrelat2->second, resborder, resglobal, fNumInternalEquations, fNEquations);
	PermuteGather(itrelat->second, resglobal, resloc, 0, u.Rows());
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Value of the local multiply = ";
		resborder.Print("resborder " ,sout);
		resglobal.Print("resglobal ",sout);
		resloc.Print("resloc ",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	int zcols = z.Cols();
	for (i=0;i<neqs;i++) {
		/* Sum row "i" of temp1 with row "fGlobalNodes[i]" of z */
		for (j=0;j<zcols;j++) {
			z(i,j) += alpha*resloc(i,j);
		}
	}
}